

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atmosphere.h
# Opt level: O1

void __thiscall
Atmosphere::print_tabular(Atmosphere *this,double h_start,double h_end,double h_step)

{
  double **table;
  uint size;
  ulong uVar1;
  
  table = tabulate(this,h_start,h_end,h_step);
  size = (uint)((h_end - h_start) / h_step + 1.0);
  print_tabular(table,size);
  if (0 < (int)size) {
    uVar1 = 0;
    do {
      if (table[uVar1] != (double *)0x0) {
        operator_delete__(table[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while (size != uVar1);
  }
  if (table != (double **)0x0) {
    operator_delete__(table);
    return;
  }
  return;
}

Assistant:

void print_tabular(double h_start, double h_end, double h_step) {
        double **result = this->tabulate(h_start, h_end, h_step);
        const int size = (const int) ((h_end - h_start) / h_step + 1);
        Atmosphere::print_tabular(result, size);

        //Free each sub-array
        for (int i = 0; i < size; ++i) {
            delete[] result[i];
        }
        //Free the array of pointers
        delete[] result;

    }